

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

optional<BCLog::Level> GetLogLevel(string_view level_str)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *__s1;
  size_t sVar5;
  long in_FS_OFFSET;
  
  __s1 = (int *)level_str._M_str;
  sVar5 = level_str._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sVar5 == 4) {
    iVar2 = bcmp(__s1,"info",4);
    if (iVar2 == 0) {
      uVar4 = 0x100000000;
      uVar3 = 2;
      goto LAB_0014e2e8;
    }
  }
  else if (sVar5 == 7) {
    iVar2 = bcmp(__s1,"warning",7);
    if (iVar2 == 0) {
      uVar4 = 0x100000000;
      uVar3 = 3;
      goto LAB_0014e2e8;
    }
  }
  else if (sVar5 == 5) {
    uVar4 = 0x100000000;
    if ((char)__s1[1] == 'e' && *__s1 == 0x63617274) {
      uVar3 = 0;
      goto LAB_0014e2e8;
    }
    if ((char)__s1[1] == 'g' && *__s1 == 0x75626564) {
      uVar3 = 1;
      goto LAB_0014e2e8;
    }
    iVar2 = bcmp(__s1,"error",5);
    if (iVar2 == 0) {
      uVar3 = 4;
      goto LAB_0014e2e8;
    }
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_0014e2e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<BCLog::Level,_true,_true>)
           (_Optional_base<BCLog::Level,_true,_true>)(uVar4 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<BCLog::Level> GetLogLevel(std::string_view level_str)
{
    if (level_str == "trace") {
        return BCLog::Level::Trace;
    } else if (level_str == "debug") {
        return BCLog::Level::Debug;
    } else if (level_str == "info") {
        return BCLog::Level::Info;
    } else if (level_str == "warning") {
        return BCLog::Level::Warning;
    } else if (level_str == "error") {
        return BCLog::Level::Error;
    } else {
        return std::nullopt;
    }
}